

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::ParseFromBoundedZeroCopyStream
          (MessageLite *this,ZeroCopyInputStream *input,int size)

{
  bool bVar1;
  int iVar2;
  CodedInputStream decoder;
  CodedInputStream local_68;
  
  local_68.buffer_ = (uint8 *)0x0;
  local_68.buffer_end_ = (uint8 *)0x0;
  local_68._24_6_ = 0;
  local_68.overflow_bytes_._2_2_ = 0;
  local_68.last_tag_ = 0;
  local_68.legitimate_message_end_ = false;
  local_68.aliasing_enabled_ = false;
  local_68.current_limit_ = 0x7fffffff;
  local_68.buffer_size_after_limit_ = 0;
  local_68.total_bytes_limit_ = 0x7fffffff;
  local_68.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
  local_68.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
  local_68.disable_strict_correctness_enforcement_ = true;
  local_68.extension_pool_ = (DescriptorPool *)0x0;
  local_68.extension_factory_ = (MessageFactory *)0x0;
  local_68.input_ = input;
  io::CodedInputStream::Refresh(&local_68);
  io::CodedInputStream::PushLimit(&local_68,size);
  bVar1 = ParseFromCodedStream(this,&local_68);
  if ((bVar1) && (local_68.legitimate_message_end_ == true)) {
    iVar2 = io::CodedInputStream::BytesUntilLimit(&local_68);
    bVar1 = iVar2 == 0;
  }
  else {
    bVar1 = false;
  }
  io::CodedInputStream::~CodedInputStream(&local_68);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFromBoundedZeroCopyStream(
    io::ZeroCopyInputStream* input, int size) {
  io::CodedInputStream decoder(input);
  decoder.PushLimit(size);
  return ParseFromCodedStream(&decoder) &&
         decoder.ConsumedEntireMessage() &&
         decoder.BytesUntilLimit() == 0;
}